

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperFloatingPointLE<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  floating_point<double> *v;
  floating_point<double> *v_00;
  floating_point<double> f2;
  floating_point<double> f1;
  FInt local_b0;
  FInt local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((val2 <= val1) &&
     (local_b0 = (FInt)val2, local_a8 = (FInt)val1,
     bVar1 = floating_point<double>::AlmostEquals
                       ((floating_point<double> *)&local_a8,(_Myt *)&local_b0), !bVar1)) {
    PrintToString<iutest::floating_point<double>>(&local_40,(iutest *)&local_a8,v);
    detail::ShowStringQuoted(&local_60,&local_40);
    PrintToString<iutest::floating_point<double>>(&local_a0,(iutest *)&local_b0,v_00);
    detail::ShowStringQuoted(&local_80,&local_a0);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_60,&local_80,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_string_length = 0;
  (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->m_result = true;
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointLE(const char* expr1, const char* expr2
                                                , RawType val1, RawType val2)
{
    if IUTEST_COND_LIKELY( val1 < val2 )
    {
        return AssertionSuccess();
    }
    floating_point<RawType> f1(val1), f2(val2);
    if IUTEST_COND_LIKELY( f1.AlmostEquals(f2) )
    {
        return AssertionSuccess();
    }